

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O0

bool __thiscall
duckdb::CatalogSet::VerifyVacancy
          (CatalogSet *this,CatalogTransaction transaction,CatalogEntry *entry)

{
  CatalogTransaction transaction_00;
  bool bVar1;
  undefined8 uVar2;
  long in_RSI;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffff28;
  string local_98 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  TransactionException *in_stack_ffffffffffffff90;
  allocator local_61;
  string local_60 [8];
  transaction_t in_stack_ffffffffffffffa8;
  CatalogSet *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  transaction_t in_stack_ffffffffffffffe0;
  
  memcpy(&stack0xffffffffffffffc0,&stack0x00000008,0x28);
  ::std::__atomic_base<unsigned_long>::operator_unsigned_long(in_stack_ffffffffffffff28);
  transaction_00.context.ptr = (ClientContext *)in_stack_ffffffffffffffc8;
  transaction_00.db.ptr = (DatabaseInstance *)in_stack_ffffffffffffffc0;
  transaction_00.transaction.ptr = (Transaction *)in_stack_ffffffffffffffd0;
  transaction_00.transaction_id = in_stack_ffffffffffffffd8;
  transaction_00.start_time = in_stack_ffffffffffffffe0;
  bVar1 = HasConflict(in_stack_ffffffffffffffb0,transaction_00,in_stack_ffffffffffffffa8);
  if (!bVar1) {
    return (*(byte *)(in_RSI + 0x40) & 1) != 0;
  }
  uVar2 = __cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_60,"Catalog write-write conflict on create with \"%s\"",&local_61);
  ::std::__cxx11::string::string(local_98,(string *)(in_RSI + 0x20));
  TransactionException::
  TransactionException<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  __cxa_throw(uVar2,&TransactionException::typeinfo,TransactionException::~TransactionException);
}

Assistant:

bool CatalogSet::VerifyVacancy(CatalogTransaction transaction, CatalogEntry &entry) {
	if (HasConflict(transaction, entry.timestamp)) {
		// A transaction that is not visible to our snapshot has already made a change to this entry.
		// Because of Catalog limitations we can't push our change on this, even if the change was made by another
		// active transaction that might end up being aborted. So we have to cancel this transaction.
		throw TransactionException("Catalog write-write conflict on create with \"%s\"", entry.name);
	}
	// The entry is visible to our snapshot
	if (!entry.deleted) {
		return false;
	}
	return true;
}